

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imtui-impl-text.cpp
# Opt level: O0

void ImTui_ImplText_RenderDrawData(ImDrawData *drawData,TScreen *screen)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  ImVec2 IVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  byte bVar8;
  int pnx;
  ImGuiIO *pIVar9;
  unsigned_short *puVar10;
  ImDrawVert *pIVar11;
  float *pfVar12;
  uint *puVar13;
  TScreen *in_RSI;
  long in_RDI;
  double dVar14;
  TCell *cell;
  int yy;
  int xx;
  float y;
  float x;
  ImVec2 ppos2;
  ImVec2 ppos1;
  ImVec2 ppos0;
  int vvidx2;
  int vvidx1;
  int vvidx0;
  ImU32 col0;
  ImVec2 uv2;
  ImVec2 uv1;
  ImVec2 uv0;
  ImVec2 pos2;
  ImVec2 pos1;
  ImVec2 pos0;
  int vidx2;
  int vidx1;
  int vidx0;
  uint i;
  float lastCharY;
  float lastCharX;
  ImVec4 clip_rect;
  ImDrawCmd *pcmd;
  int cmd_i;
  ImDrawList *cmd_list;
  int n;
  ImVec2 clip_scale;
  ImVec2 clip_off;
  int fb_height;
  int fb_width;
  int in_stack_fffffffffffffee8;
  ImVec2 in_stack_fffffffffffffef0;
  int in_stack_ffffffffffffff10;
  int in_stack_ffffffffffffff14;
  float local_e8;
  float in_stack_ffffffffffffff1c;
  ImVec2 in_stack_ffffffffffffff20;
  ImVec2 in_stack_ffffffffffffff28;
  ImVec2 in_stack_ffffffffffffff30;
  float local_b8;
  float fStack_b4;
  float local_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float local_a0;
  float local_9c;
  float local_98;
  float local_94;
  float local_90;
  float local_8c;
  ImVec2 local_88;
  ImVec2 local_80;
  ImVec2 local_78;
  uint local_70;
  uint local_6c;
  uint local_68;
  uint local_64;
  float local_60;
  float local_5c;
  ImVec4 local_58;
  ImDrawCmd *local_48;
  int local_3c;
  ImVector<ImDrawCmd> *local_38;
  int local_2c;
  undefined8 local_28;
  undefined8 local_20;
  int local_18;
  int local_14;
  TScreen *local_10;
  long local_8;
  
  local_14 = (int)(*(float *)(in_RDI + 0x20) * *(float *)(in_RDI + 0x28));
  local_18 = (int)(*(float *)(in_RDI + 0x24) * *(float *)(in_RDI + 0x2c));
  if ((0 < local_14) && (0 < local_18)) {
    local_10 = in_RSI;
    local_8 = in_RDI;
    pIVar9 = ImGui::GetIO();
    pnx = (int)(pIVar9->DisplaySize).x;
    ImGui::GetIO();
    ImTui::TScreen::resize((TScreen *)in_stack_fffffffffffffef0,pnx,in_stack_fffffffffffffee8);
    ImTui::TScreen::clear(in_RSI);
    local_20 = *(undefined8 *)(local_8 + 0x18);
    local_28 = *(undefined8 *)(local_8 + 0x28);
    for (local_2c = 0; local_2c < *(int *)(local_8 + 4); local_2c = local_2c + 1) {
      local_38 = *(ImVector<ImDrawCmd> **)(*(long *)(local_8 + 0x10) + (long)local_2c * 8);
      for (local_3c = 0; local_3c < local_38->Size; local_3c = local_3c + 1) {
        local_48 = ImVector<ImDrawCmd>::operator[](local_38,local_3c);
        ImVec4::ImVec4(&local_58);
        local_58.x = ((local_48->ClipRect).x - (float)local_20) * (float)local_28;
        local_58.y = ((local_48->ClipRect).y - local_20._4_4_) * local_28._4_4_;
        local_58.z = ((local_48->ClipRect).z - (float)local_20) * (float)local_28;
        local_58.w = ((local_48->ClipRect).w - local_20._4_4_) * local_28._4_4_;
        if ((((local_58.x < (float)local_14) && (local_58.y < (float)local_18)) &&
            (0.0 <= local_58.z)) && (0.0 <= local_58.w)) {
          local_5c = -10000.0;
          local_60 = -10000.0;
          for (local_64 = 0; local_64 < local_48->ElemCount; local_64 = local_64 + 3) {
            puVar10 = ImVector<unsigned_short>::operator[]
                                ((ImVector<unsigned_short> *)(local_38 + 1),
                                 local_48->IdxOffset + local_64);
            local_68 = (uint)*puVar10;
            puVar10 = ImVector<unsigned_short>::operator[]
                                ((ImVector<unsigned_short> *)(local_38 + 1),
                                 local_48->IdxOffset + local_64 + 1);
            local_6c = (uint)*puVar10;
            puVar10 = ImVector<unsigned_short>::operator[]
                                ((ImVector<unsigned_short> *)(local_38 + 1),
                                 local_48->IdxOffset + local_64 + 2);
            local_70 = (uint)*puVar10;
            pIVar11 = ImVector<ImDrawVert>::operator[]
                                ((ImVector<ImDrawVert> *)(local_38 + 2),local_68);
            local_78 = pIVar11->pos;
            pIVar11 = ImVector<ImDrawVert>::operator[]
                                ((ImVector<ImDrawVert> *)(local_38 + 2),local_6c);
            local_80 = pIVar11->pos;
            pIVar11 = ImVector<ImDrawVert>::operator[]
                                ((ImVector<ImDrawVert> *)(local_38 + 2),local_70);
            local_88 = pIVar11->pos;
            local_8c = local_58.z - 1.0;
            pfVar12 = std::min<float>(&local_8c,&local_78.x);
            pfVar12 = std::max<float>(pfVar12,&local_58.x);
            local_78.x = *pfVar12;
            local_90 = local_58.z - 1.0;
            pfVar12 = std::min<float>(&local_90,&local_80.x);
            pfVar12 = std::max<float>(pfVar12,&local_58.x);
            local_80.x = *pfVar12;
            local_94 = local_58.z - 1.0;
            pfVar12 = std::min<float>(&local_94,&local_88.x);
            pfVar12 = std::max<float>(pfVar12,&local_58.x);
            local_88.x = *pfVar12;
            local_98 = local_58.w - 1.0;
            pfVar12 = std::min<float>(&local_98,&local_78.y);
            pfVar12 = std::max<float>(pfVar12,&local_58.y);
            local_78.y = *pfVar12;
            local_9c = local_58.w - 1.0;
            pfVar12 = std::min<float>(&local_9c,&local_80.y);
            pfVar12 = std::max<float>(pfVar12,&local_58.y);
            local_80.y = *pfVar12;
            local_a0 = local_58.w - 1.0;
            pfVar12 = std::min<float>(&local_a0,&local_88.y);
            pfVar12 = std::max<float>(pfVar12,&local_58.y);
            local_88.y = *pfVar12;
            pIVar11 = ImVector<ImDrawVert>::operator[]
                                ((ImVector<ImDrawVert> *)(local_38 + 2),local_68);
            IVar5 = pIVar11->uv;
            pIVar11 = ImVector<ImDrawVert>::operator[]
                                ((ImVector<ImDrawVert> *)(local_38 + 2),local_6c);
            IVar6 = pIVar11->uv;
            pIVar11 = ImVector<ImDrawVert>::operator[]
                                ((ImVector<ImDrawVert> *)(local_38 + 2),local_70);
            IVar7 = pIVar11->uv;
            pIVar11 = ImVector<ImDrawVert>::operator[]
                                ((ImVector<ImDrawVert> *)(local_38 + 2),local_68);
            uVar4 = pIVar11->col;
            local_a8 = IVar5.x;
            local_b0 = IVar6.x;
            if (((local_a8 != local_b0) || (local_b8 = IVar7.x, local_a8 != local_b8)) ||
               ((local_b0 != local_b8 || (NAN(local_b0) || NAN(local_b8))))) {
LAB_0011fe75:
              puVar10 = ImVector<unsigned_short>::operator[]
                                  ((ImVector<unsigned_short> *)(local_38 + 1),
                                   local_48->IdxOffset + local_64 + 3);
              uVar1 = *puVar10;
              puVar10 = ImVector<unsigned_short>::operator[]
                                  ((ImVector<unsigned_short> *)(local_38 + 1),
                                   local_48->IdxOffset + local_64 + 4);
              uVar2 = *puVar10;
              puVar10 = ImVector<unsigned_short>::operator[]
                                  ((ImVector<unsigned_short> *)(local_38 + 1),
                                   local_48->IdxOffset + local_64 + 5);
              uVar3 = *puVar10;
              pIVar11 = ImVector<ImDrawVert>::operator[]
                                  ((ImVector<ImDrawVert> *)(local_38 + 2),(uint)uVar1);
              in_stack_ffffffffffffff30 = pIVar11->pos;
              pIVar11 = ImVector<ImDrawVert>::operator[]
                                  ((ImVector<ImDrawVert> *)(local_38 + 2),(uint)uVar2);
              in_stack_ffffffffffffff28 = pIVar11->pos;
              pIVar11 = ImVector<ImDrawVert>::operator[]
                                  ((ImVector<ImDrawVert> *)(local_38 + 2),(uint)uVar3);
              in_stack_ffffffffffffff20 = pIVar11->pos;
              in_stack_ffffffffffffff1c =
                   (local_78.x + local_80.x + local_88.x + in_stack_ffffffffffffff30.x +
                    in_stack_ffffffffffffff28.x + in_stack_ffffffffffffff20.x) / 6.0;
              local_e8 = (local_78.y + local_80.y + local_88.y + in_stack_ffffffffffffff30.y +
                          in_stack_ffffffffffffff28.y + in_stack_ffffffffffffff20.y) / 6.0 + 0.5;
              dVar14 = std::fabs((double)(ulong)(uint)(local_e8 - local_60));
              if ((SUB84(dVar14,0) < 0.5) &&
                 (dVar14 = std::fabs((double)(ulong)(uint)(in_stack_ffffffffffffff1c - local_5c)),
                 SUB84(dVar14,0) < 0.5)) {
                in_stack_ffffffffffffff1c = local_5c + 1.0;
                local_e8 = local_60;
              }
              local_60 = local_e8;
              in_stack_ffffffffffffff14 = (int)(in_stack_ffffffffffffff1c + 1.0);
              in_stack_ffffffffffffff10 = (int)(local_e8 + 0.0);
              local_5c = in_stack_ffffffffffffff1c;
              if ((((local_58.x <= (float)in_stack_ffffffffffffff14) &&
                   ((float)in_stack_ffffffffffffff14 < local_58.z)) &&
                  (local_58.y <= (float)in_stack_ffffffffffffff10)) &&
                 ((float)in_stack_ffffffffffffff10 < local_58.w)) {
                puVar13 = local_10->data +
                          (in_stack_ffffffffffffff10 * local_10->nx + in_stack_ffffffffffffff14);
                *puVar13 = *puVar13 & 0xff000000;
                *puVar13 = uVar4 >> 0x18 | *puVar13;
                bVar8 = rgbToAnsi256((ImU32)in_stack_fffffffffffffef0.x,SUB41((uint)pnx >> 0x18,0));
                *puVar13 = (uint)bVar8 << 0x10 | *puVar13;
              }
              local_64 = local_64 + 3;
            }
            else {
              fStack_a4 = IVar5.y;
              fStack_ac = IVar6.y;
              if (((fStack_a4 != fStack_ac) || (fStack_b4 = IVar7.y, fStack_a4 != fStack_b4)) ||
                 ((fStack_ac != fStack_b4 || (NAN(fStack_ac) || NAN(fStack_b4)))))
              goto LAB_0011fe75;
              in_stack_fffffffffffffef0 = local_88;
              rgbToAnsi256((ImU32)local_88.x,SUB41((uint)pnx >> 0x18,0));
              drawTriangle(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28,
                           in_stack_ffffffffffffff20,
                           (uchar)((uint)in_stack_ffffffffffffff1c >> 0x18),
                           (TScreen *)CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10))
              ;
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void ImTui_ImplText_RenderDrawData(ImDrawData * drawData, ImTui::TScreen * screen) {
    // Avoid rendering when minimized, scale coordinates for retina displays (screen coordinates != framebuffer coordinates)
    int fb_width = (int)(drawData->DisplaySize.x * drawData->FramebufferScale.x);
    int fb_height = (int)(drawData->DisplaySize.y * drawData->FramebufferScale.y);

    if (fb_width <= 0 || fb_height <= 0) {
        return;
    }

    screen->resize(ImGui::GetIO().DisplaySize.x, ImGui::GetIO().DisplaySize.y);
    screen->clear();

    // Will project scissor/clipping rectangles into framebuffer space
    ImVec2 clip_off = drawData->DisplayPos;         // (0,0) unless using multi-viewports
    ImVec2 clip_scale = drawData->FramebufferScale; // (1,1) unless using retina display which are often (2,2)

    // Render command lists
    for (int n = 0; n < drawData->CmdListsCount; n++)
    {
        const ImDrawList* cmd_list = drawData->CmdLists[n];

        for (int cmd_i = 0; cmd_i < cmd_list->CmdBuffer.Size; cmd_i++)
        {
            const ImDrawCmd* pcmd = &cmd_list->CmdBuffer[cmd_i];
            {
                ImVec4 clip_rect;
                clip_rect.x = (pcmd->ClipRect.x - clip_off.x) * clip_scale.x;
                clip_rect.y = (pcmd->ClipRect.y - clip_off.y) * clip_scale.y;
                clip_rect.z = (pcmd->ClipRect.z - clip_off.x) * clip_scale.x;
                clip_rect.w = (pcmd->ClipRect.w - clip_off.y) * clip_scale.y;

                if (clip_rect.x < fb_width && clip_rect.y < fb_height && clip_rect.z >= 0.0f && clip_rect.w >= 0.0f)
                {
                    float lastCharX = -10000.0f;
                    float lastCharY = -10000.0f;

                    for (unsigned int i = 0; i < pcmd->ElemCount; i += 3) {
                        int vidx0 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 0];
                        int vidx1 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 1];
                        int vidx2 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 2];

                        auto pos0 = cmd_list->VtxBuffer[vidx0].pos;
                        auto pos1 = cmd_list->VtxBuffer[vidx1].pos;
                        auto pos2 = cmd_list->VtxBuffer[vidx2].pos;

                        pos0.x = std::max(std::min(float(clip_rect.z - 1), pos0.x), clip_rect.x);
                        pos1.x = std::max(std::min(float(clip_rect.z - 1), pos1.x), clip_rect.x);
                        pos2.x = std::max(std::min(float(clip_rect.z - 1), pos2.x), clip_rect.x);
                        pos0.y = std::max(std::min(float(clip_rect.w - 1), pos0.y), clip_rect.y);
                        pos1.y = std::max(std::min(float(clip_rect.w - 1), pos1.y), clip_rect.y);
                        pos2.y = std::max(std::min(float(clip_rect.w - 1), pos2.y), clip_rect.y);

                        auto uv0 = cmd_list->VtxBuffer[vidx0].uv;
                        auto uv1 = cmd_list->VtxBuffer[vidx1].uv;
                        auto uv2 = cmd_list->VtxBuffer[vidx2].uv;

                        auto col0 = cmd_list->VtxBuffer[vidx0].col;
                        //auto col1 = cmd_list->VtxBuffer[vidx1].col;
                        //auto col2 = cmd_list->VtxBuffer[vidx2].col;

                        if (uv0.x != uv1.x || uv0.x != uv2.x || uv1.x != uv2.x ||
                            uv0.y != uv1.y || uv0.y != uv2.y || uv1.y != uv2.y) {
                            int vvidx0 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 3];
                            int vvidx1 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 4];
                            int vvidx2 = cmd_list->IdxBuffer[pcmd->IdxOffset + i + 5];

                            auto ppos0 = cmd_list->VtxBuffer[vvidx0].pos;
                            auto ppos1 = cmd_list->VtxBuffer[vvidx1].pos;
                            auto ppos2 = cmd_list->VtxBuffer[vvidx2].pos;

                            float x = ((pos0.x + pos1.x + pos2.x + ppos0.x + ppos1.x + ppos2.x)/6.0f);
                            float y = ((pos0.y + pos1.y + pos2.y + ppos0.y + ppos1.y + ppos2.y)/6.0f) + 0.5f;

                            if (std::fabs(y - lastCharY) < 0.5f && std::fabs(x - lastCharX) < 0.5f) {
                                x = lastCharX + 1.0f;
                                y = lastCharY;
                            }

                            lastCharX = x;
                            lastCharY = y;

                            int xx = (x) + 1;
                            int yy = (y) + 0;
                            if (xx < clip_rect.x || xx >= clip_rect.z || yy < clip_rect.y || yy >= clip_rect.w) {
                            } else {
                                auto & cell = screen->data[yy*screen->nx + xx];
                                cell &= 0xFF000000;
                                cell |= (col0 & 0xff000000) >> 24;
                                cell |= ((ImTui::TCell)(rgbToAnsi256(col0, false)) << 16);
                            }
                            i += 3;
                        } else {
                            drawTriangle(pos0, pos1, pos2, rgbToAnsi256(col0, true), screen);
                        }
                    }
                }
            }
        }
    }

}